

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O3

void __thiscall crnlib::dxt5_block::flip_x(dxt5_block *this,uint w,uint h)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint bit_ofs;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  if (1 < w) {
    uVar7 = w * 3;
    uVar13 = 0;
    uVar10 = 0;
    do {
      uVar7 = uVar7 - 3;
      uVar8 = uVar7;
      uVar12 = uVar13;
      uVar11 = h;
      if (h != 0) {
        do {
          uVar9 = (ulong)(uVar12 >> 3);
          bVar1 = this->m_selectors[uVar9];
          uVar6 = (uint)bVar1;
          if (uVar12 < 0x28) {
            uVar6 = (uint)CONCAT11(this->m_selectors[uVar9 + 1],bVar1);
          }
          bVar3 = (byte)uVar12 & 7;
          uVar2 = (ulong)(uVar8 >> 3);
          uVar5 = (uint)this->m_selectors[uVar2];
          if (uVar8 < 0x28) {
            uVar5 = (uint)CONCAT11(this->m_selectors[uVar2 + 1],this->m_selectors[uVar2]);
          }
          bVar4 = (byte)uVar8 & 7;
          uVar5 = uVar5 >> bVar4 & 7;
          if (uVar12 < 0x28) {
            uVar5 = uVar5 << bVar3 |
                    ~(7 << bVar3) & (uint)CONCAT11(this->m_selectors[uVar9 + 1],bVar1);
            this->m_selectors[uVar9 + 1] = (uint8)(uVar5 >> 8);
          }
          else {
            uVar5 = uVar5 << bVar3 | (uint)bVar1 & ~(7 << bVar3);
          }
          uVar6 = uVar6 >> bVar3 & 7;
          this->m_selectors[uVar9] = (uint8)uVar5;
          if (uVar8 < 0x28) {
            uVar6 = uVar6 << bVar4 |
                    ~(7 << bVar4) &
                    (uint)CONCAT11(this->m_selectors[uVar2 + 1],this->m_selectors[uVar2]);
            this->m_selectors[uVar2 + 1] = (uint8)(uVar6 >> 8);
          }
          else {
            uVar6 = uVar6 << bVar4 | (uint)this->m_selectors[uVar2] & ~(7 << bVar4);
          }
          this->m_selectors[uVar2] = (uint8)uVar6;
          uVar8 = uVar8 + 0xc;
          uVar12 = uVar12 + 0xc;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      uVar10 = uVar10 + 1;
      uVar13 = uVar13 + 3;
    } while (uVar10 != w >> 1);
  }
  return;
}

Assistant:

inline void flip_x(uint w = 4, uint h = 4) {
    for (uint x = 0; x < (w / 2); x++) {
      for (uint y = 0; y < h; y++) {
        const uint c = get_selector(x, y);
        set_selector(x, y, get_selector((w - 1) - x, y));
        set_selector((w - 1) - x, y, c);
      }
    }
  }